

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_zuncompress_and_write(int hdl,void *buffer,long nbytes)

{
  int in_EDI;
  int status;
  size_t newsize;
  size_t *in_stack_00000040;
  _func_void_ptr_void_ptr_size_t *in_stack_00000048;
  size_t *in_stack_00000050;
  char **in_stack_00000058;
  size_t in_stack_00000060;
  char *in_stack_00000068;
  int *in_stack_00000080;
  long local_20;
  int local_4;
  
  if (memTable[in_EDI].currentpos == 0) {
    uncompress2mem_from_mem
              (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
               in_stack_00000048,in_stack_00000040,in_stack_00000080);
    memTable[in_EDI].currentpos = local_20 + memTable[in_EDI].currentpos;
    memTable[in_EDI].fitsfilesize = local_20;
    local_4 = 0;
  }
  else {
    ffpmsg((char *)0x1254a0);
    local_4 = 0x6a;
  }
  return local_4;
}

Assistant:

int mem_zuncompress_and_write(int hdl, void *buffer, long nbytes)
/*
  uncompress input buffer, length nbytes and write bytes to current
  position in file.  output buffer needs to be at position 0 to start.
*/
{
  size_t newsize;
  int status = 0;

  if (memTable[hdl].currentpos != 0) {
      ffpmsg("cannot append uncompressed data (mem_uncompress_and_write)");
      return(WRITE_ERROR);
  }

  uncompress2mem_from_mem(buffer, nbytes,
			  memTable[hdl].memaddrptr,
			  memTable[hdl].memsizeptr,
			  memTable[hdl].mem_realloc, 
			  &newsize, &status);
  
  if (status) {
    ffpmsg("unabled to uncompress memory file (mem_uncompress_and_write)");
    return(WRITE_ERROR);
  }

  memTable[hdl].currentpos += newsize;
  memTable[hdl].fitsfilesize = newsize;
  return(0);
}